

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::iterate
          (StorageMultisampleTest *this)

{
  GLuint width;
  GLuint height;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ContextType ctxType;
  deUint32 dVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint max_integer_samples;
  GLint max_renderbuffer_size;
  anon_struct_8_2_6a0cb59c test_cases [3];
  long local_68;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 *local_4c;
  undefined4 local_44;
  long local_38;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(lVar7 + 0x868))(0x84e8);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x20fc);
    (**(code **)(lVar7 + 0x868))(0x9110);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x2101);
    local_58 = &DAT_100000001;
    local_50 = 0x2000;
    local_4c = &DAT_100000001;
    local_44 = 0x2000;
    bVar3 = 1;
    local_68 = 0;
    do {
      lVar7 = 0;
      do {
        local_38 = lVar7;
        width = *(GLuint *)(&local_58 + local_68);
        height = *(GLuint *)((long)&local_58 + local_68 * 8 + 4);
        iVar4 = 0;
        do {
          bVar1 = PrepareRenderbuffer(this,*(RenderbufferInternalFormatConfiguration *)
                                            (s_renderbuffer_internalformat_configuration +
                                            lVar7 * 0x18),width,height,iVar4);
          if (bVar1) {
            iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
            (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x78))(0x8ca9,this->m_fbo[0]);
            dVar5 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
            glu::checkError(dVar5,"glBindFramebuffer call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x21ab);
            Clear(this,*(bool *)(lVar7 * 0x18 + 0x20e5a06));
            iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
            (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x78))(0x8ca8,this->m_fbo[0]);
            dVar5 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x800))();
            glu::checkError(dVar5,"glBindFramebuffer call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x21ab);
            iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
            (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x78))(0x8ca9,this->m_fbo[1]);
            dVar5 = (**(code **)(CONCAT44(extraout_var_02,iVar6) + 0x800))();
            glu::checkError(dVar5,"glBindFramebuffer call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x21ab);
            Blit(this,width,height);
            iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
            (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x78))(0x8ca8,this->m_fbo[1]);
            dVar5 = (**(code **)(CONCAT44(extraout_var_03,iVar6) + 0x800))();
            glu::checkError(dVar5,"glBindFramebuffer call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x21ab);
            bVar1 = Check(this,*(RenderbufferInternalFormatConfiguration *)
                                (s_renderbuffer_internalformat_configuration + lVar7 * 0x18),width,
                          height);
            bVar3 = bVar1 & bVar3;
          }
          else {
            bVar3 = 0;
          }
          Clean(this);
          iVar4 = iVar4 + 1;
        } while (iVar4 < 2);
        lVar7 = local_38 + 1;
      } while (lVar7 != 0x2b);
      local_68 = local_68 + 1;
    } while (local_68 != 3);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3 == 0) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageMultisampleTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		glw::GLint max_renderbuffer_size = 16384 /* Specification minimum. */;

		gl.getIntegerv(GL_MAX_RENDERBUFFER_SIZE, &max_renderbuffer_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		glw::GLint max_integer_samples = 1 /* Specification minimum. */;

		gl.getIntegerv(GL_MAX_INTEGER_SAMPLES, &max_integer_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		const struct
		{
			glw::GLuint width;
			glw::GLuint height;
		} test_cases[] = { { 1, 1 },
						   { (glw::GLuint)max_renderbuffer_size / 2, 1 },
						   { 1, (glw::GLuint)max_renderbuffer_size / 2 } };

		const glw::GLuint test_cases_count = sizeof(test_cases) / sizeof(test_cases[0]);

		for (glw::GLuint i = 0; i < test_cases_count; ++i)
		{
			for (glw::GLuint j = 0; j < s_renderbuffer_internalformat_configuration_count; ++j)
			{
				for (glw::GLint k = 0; k <= max_integer_samples; ++k)
				{
					if (PrepareRenderbuffer(s_renderbuffer_internalformat_configuration[j], test_cases[i].width,
											test_cases[i].height, k))
					{
						Bind(GL_DRAW_FRAMEBUFFER, 0);
						Clear(s_renderbuffer_internalformat_configuration[j].isColorIntegralFormat);
						Bind(GL_READ_FRAMEBUFFER, 0);
						Bind(GL_DRAW_FRAMEBUFFER, 1);
						Blit(test_cases[i].width, test_cases[i].height);
						Bind(GL_READ_FRAMEBUFFER, 1);
						is_ok &= Check(s_renderbuffer_internalformat_configuration[j], test_cases[i].width,
									   test_cases[i].height);
					}
					else
					{
						is_ok = false;
					}

					Clean();
				}
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;

		Clean();
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}